

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_steal_queue.h
# Opt level: O0

circular_array * __thiscall
async::detail::work_steal_queue::circular_array::grow(circular_array *this,size_t top,size_t bottom)

{
  circular_array *this_00;
  size_t sVar1;
  void *x;
  size_t local_40;
  size_t i;
  circular_array *new_array;
  size_t bottom_local;
  size_t top_local;
  circular_array *this_local;
  
  this_00 = (circular_array *)operator_new(0x18);
  sVar1 = size(this);
  circular_array(this_00,sVar1 * 2);
  std::
  unique_ptr<async::detail::work_steal_queue::circular_array,_std::default_delete<async::detail::work_steal_queue::circular_array>_>
  ::reset(&this_00->previous,this);
  for (local_40 = top; local_40 != bottom; local_40 = local_40 + 1) {
    x = get(this,local_40);
    put(this_00,local_40,x);
  }
  return this_00;
}

Assistant:

circular_array* grow(std::size_t top, std::size_t bottom)
		{
			circular_array* new_array = new circular_array(size() * 2);
			new_array->previous.reset(this);
			for (std::size_t i = top; i != bottom; i++)
				new_array->put(i, get(i));
			return new_array;
		}